

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O2

void __thiscall
fill<64U,_2U,_buffer_layout_dfs>::operator()
          (fill<64U,_2U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  int iVar5;
  ostream *poVar6;
  unsigned_long *puVar7;
  unsigned_long uVar8;
  uchar **ppuVar9;
  unsigned_long uVar10;
  long lVar11;
  long lVar12;
  size_t __n;
  size_t n0;
  fill<64U,_4U,_buffer_layout_dfs> local_54;
  fill<64U,_5U,_buffer_layout_dfs> local_53;
  fill<64U,_5U,_buffer_layout_dfs> local_52;
  fill<64U,_4U,_buffer_layout_dfs> local_51;
  array<Stream,_64UL> *local_50;
  uchar **local_48;
  DI __d;
  
  local_50 = streams;
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"fill_inner");
  poVar6 = std::operator<<(poVar6,", inner, I=");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,"\n");
  __d.i = &__debug_indent_str_abi_cxx11_;
  std::__cxx11::string::append((char *)&__debug_indent_str_abi_cxx11_);
  puVar1 = buffer_count->_M_elems + 4;
  puVar2 = buffer_count->_M_elems + 5;
  local_48 = buffer + 8;
  lVar12 = 0;
  n0 = 0;
  do {
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      fill<64U,_4U,_buffer_layout_dfs>::operator()(&local_51,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"left stream drained\n");
        lVar12 = -0x40 - lVar12;
        lVar11 = 8 - n0;
        uVar8 = *puVar2;
        goto LAB_0019ae72;
      }
    }
    uVar10 = *puVar2;
    if (uVar10 == 0) {
      fill<64U,_5U,_buffer_layout_dfs>::operator()(&local_52,local_50,buffer,buffer_count);
      uVar10 = *puVar2;
      if (uVar10 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"right stream drained\n");
        __n = -lVar12;
        lVar12 = -n0;
        uVar8 = *puVar1;
        goto LAB_0019af33;
      }
      uVar8 = *puVar1;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"L:\'");
    ppuVar9 = local_48 + (0x17 - uVar8);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar9);
    poVar6 = std::operator<<(poVar6,"\', R:\'");
    ppuVar4 = buffer + (0x50e - uVar10);
    poVar6 = std::operator<<(poVar6,(char *)*ppuVar4);
    std::operator<<(poVar6,"\'\n");
    iVar5 = cmp(*ppuVar9,*ppuVar4);
    puVar7 = puVar2;
    if (iVar5 < 1) {
      puVar7 = puVar1;
      ppuVar4 = ppuVar9;
    }
    puVar3 = *ppuVar4;
    *puVar7 = *puVar7 - 1;
    buffer[n0] = puVar3;
    check_input(buffer,n0);
    n0 = n0 + 1;
    lVar12 = lVar12 + -8;
  } while (n0 != 8);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"Done, buffer filled\n");
  buffer_count->_M_elems[2] = 8;
  goto LAB_0019b063;
LAB_0019ae72:
  do {
    if (uVar8 == 0) {
      fill<64U,_5U,_buffer_layout_dfs>::operator()(&local_53,local_50,buffer,buffer_count);
      uVar8 = *puVar2;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        memmove(buffer + lVar11,buffer,lVar12 + 0x40);
        buffer_count->_M_elems[2] = n0;
        check_input((uchar **)((long)buffer - lVar12),n0);
        goto LAB_0019b063;
      }
    }
    buffer[n0] = buffer[0x50e - uVar8];
    uVar8 = uVar8 - 1;
    *puVar2 = uVar8;
    lVar11 = lVar11 + -1;
    n0 = n0 + 1;
    lVar12 = lVar12 + 8;
  } while (lVar12 != 0);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"\tbuffer filled\n");
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
  goto LAB_0019b063;
LAB_0019af33:
  do {
    if (uVar8 == 0) {
      fill<64U,_4U,_buffer_layout_dfs>::operator()(&local_54,local_50,buffer,buffer_count);
      uVar8 = *puVar1;
      if (uVar8 == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar6,"both streams prematurely drained\n");
        ppuVar9 = (uchar **)((long)local_48 - __n);
        memmove(local_48 + lVar12,buffer,__n);
        buffer_count->_M_elems[2] = -lVar12;
        check_input(ppuVar9,-lVar12);
        goto LAB_0019b063;
      }
    }
    *(uchar **)((long)buffer + __n) = buffer[0x1f - uVar8];
    uVar8 = uVar8 - 1;
    *puVar1 = uVar8;
    lVar12 = lVar12 + -1;
    __n = __n + 8;
  } while (__n != 0x40);
  poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar6,"buffer filled\n");
  buffer_count->_M_elems[2] = 8;
  check_input(buffer,8);
LAB_0019b063:
  anon_func::DI::~DI(&__d);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}